

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
parse_format_string<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,null_terminating_iterator<char> it,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  iterator begin;
  iterator it_00;
  iterator it_01;
  iterator begin_00;
  iterator end;
  iterator begin_01;
  char *this_00;
  char cVar1;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *handler_00;
  iterator iVar2;
  null_terminating_iterator<char> nVar3;
  internal *local_110;
  char *local_108;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_f0;
  char *local_e8;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  local_c0;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_b8;
  char *local_b0;
  null_terminating_iterator<char> local_a8;
  null_terminating_iterator<char> local_98;
  internal *local_88;
  char *local_80;
  null_terminating_iterator<char> local_78;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_68;
  char *local_60;
  internal *local_58;
  char *local_50;
  null_terminating_iterator<char> local_48;
  char local_31;
  internal *piStack_30;
  char_type ch;
  null_terminating_iterator<char> start;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *handler_local;
  null_terminating_iterator<char> it_local;
  
  start.end_ = it.end_;
  start.ptr_ = it.ptr_;
  piStack_30 = this;
  handler_local =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)this;
  it_local.ptr_ = start.ptr_;
  do {
    while( true ) {
      do {
        cVar1 = null_terminating_iterator<char>::operator*
                          ((null_terminating_iterator<char> *)&handler_local);
        if (cVar1 == '\0') {
          begin.end_ = start.ptr_;
          begin.ptr_ = (char *)piStack_30;
          iVar2.end_ = it_local.ptr_;
          iVar2.ptr_ = (char *)handler_local;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     *)start.end_,begin,iVar2);
          return;
        }
        local_48 = null_terminating_iterator<char>::operator++
                             ((null_terminating_iterator<char> *)&handler_local,0);
        local_31 = null_terminating_iterator<char>::operator*(&local_48);
      } while ((local_31 != '{') && (local_31 != '}'));
      cVar1 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local);
      this_00 = start.end_;
      if (cVar1 != local_31) break;
      local_58 = piStack_30;
      local_50 = start.ptr_;
      local_68 = handler_local;
      local_60 = it_local.ptr_;
      begin_01.end_ = start.ptr_;
      begin_01.ptr_ = (char *)piStack_30;
      end.end_ = it_local.ptr_;
      end.ptr_ = (char *)handler_local;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 *)start.end_,begin_01,end);
      local_78 = null_terminating_iterator<char>::operator++
                           ((null_terminating_iterator<char> *)&handler_local);
      piStack_30 = (internal *)local_78.ptr_;
      start.ptr_ = local_78.end_;
    }
    if (local_31 == '}') {
      error_handler::on_error((error_handler *)start.end_,"unmatched \'}\' in format string");
      return;
    }
    local_88 = piStack_30;
    local_80 = start.ptr_;
    local_98 = null_terminating_iterator<char>::operator-
                         ((null_terminating_iterator<char> *)&handler_local,1);
    begin_00.end_ = local_80;
    begin_00.ptr_ = (char *)local_88;
    handler_00 = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                  *)local_98.ptr_;
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::on_text((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *)this_00,begin_00,local_98);
    local_b8 = handler_local;
    local_b0 = it_local.ptr_;
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::id_adapter(&local_c0,
                 (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)start.end_);
    nVar3.end_ = (char *)&local_c0;
    nVar3.ptr_ = local_b0;
    local_a8 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                         ((internal *)local_b8,nVar3,handler_00);
    handler_local =
         (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)local_a8.ptr_;
    it_local.ptr_ = local_a8.end_;
    cVar1 = null_terminating_iterator<char>::operator*
                      ((null_terminating_iterator<char> *)&handler_local);
    if (cVar1 == '}') {
      it_01.end_ = it_local.ptr_;
      it_01.ptr_ = (char *)handler_local;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_replacement_field
                ((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)start.end_,it_01);
    }
    else {
      cVar1 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local);
      if (cVar1 != ':') {
        error_handler::on_error((error_handler *)start.end_,"missing \'}\' in format string");
        return;
      }
      null_terminating_iterator<char>::operator++((null_terminating_iterator<char> *)&handler_local)
      ;
      it_00.end_ = it_local.ptr_;
      it_00.ptr_ = (char *)handler_local;
      iVar2 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::on_format_specs((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                                 *)start.end_,it_00);
      local_f0 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)iVar2.ptr_;
      handler_local = local_f0;
      local_e8 = iVar2.end_;
      it_local.ptr_ = local_e8;
      cVar1 = null_terminating_iterator<char>::operator*
                        ((null_terminating_iterator<char> *)&handler_local);
      if (cVar1 != '}') {
        error_handler::on_error((error_handler *)start.end_,"unknown format specifier");
        return;
      }
    }
    nVar3 = null_terminating_iterator<char>::operator++
                      ((null_terminating_iterator<char> *)&handler_local);
    local_110 = (internal *)nVar3.ptr_;
    piStack_30 = local_110;
    local_108 = nVar3.end_;
    start.ptr_ = local_108;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(Iterator it, Handler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  auto start = it;
  while (*it) {
    char_type ch = *it++;
    if (ch != '{' && ch != '}') continue;
    if (*it == ch) {
      handler.on_text(start, it);
      start = ++it;
      continue;
    }
    if (ch == '}') {
      handler.on_error("unmatched '}' in format string");
      return;
    }
    handler.on_text(start, it - 1);

    it = parse_arg_id(it, id_adapter<Handler, char_type>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }

    start = ++it;
  }
  handler.on_text(start, it);
}